

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_free.c
# Opt level: O3

void lysp_when_free(lysf_ctx *ctx,lysp_when *when)

{
  lysp_ext_instance *plVar1;
  long lVar2;
  lysp_ext_instance *plVar3;
  
  lydict_remove(ctx->ctx,when->cond);
  lydict_remove(ctx->ctx,when->dsc);
  lydict_remove(ctx->ctx,when->ref);
  plVar1 = when->exts;
  if (plVar1 != (lysp_ext_instance *)0x0) {
    plVar3 = (lysp_ext_instance *)0xffffffffffffffff;
    lVar2 = 0;
    do {
      plVar3 = (lysp_ext_instance *)((long)&plVar3->name + 1);
      if (plVar1[-1].exts <= plVar3) {
        free(&plVar1[-1].exts);
        return;
      }
      plVar1 = (lysp_ext_instance *)((long)&plVar1->name + lVar2);
      lVar2 = lVar2 + 0x70;
      lysp_ext_instance_free(ctx,plVar1);
      plVar1 = when->exts;
    } while (plVar1 != (lysp_ext_instance *)0x0);
  }
  return;
}

Assistant:

void
lysp_when_free(struct lysf_ctx *ctx, struct lysp_when *when)
{
    lydict_remove(ctx->ctx, when->cond);
    lydict_remove(ctx->ctx, when->dsc);
    lydict_remove(ctx->ctx, when->ref);
    FREE_ARRAY(ctx, when->exts, lysp_ext_instance_free);
}